

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O0

bool dxil_spv::emit_dxil_std450_unary_instruction
               (GLSLstd450 opcode,Impl *impl,CallInst *instruction)

{
  Builder *pBVar1;
  bool bVar2;
  Id IVar3;
  Value *pVVar4;
  CallInst *pCVar5;
  Operation *this;
  Type *type;
  byte local_6d;
  Id local_6c;
  Id id;
  Operation *op;
  Value *base_value;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_50;
  byte local_29;
  Builder *pBStack_28;
  bool precise;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  GLSLstd450 opcode_local;
  
  builder = (Builder *)instruction;
  instruction_local = (CallInst *)impl;
  impl_local._0_4_ = opcode;
  pBStack_28 = Converter::Impl::builder(impl);
  pBVar1 = builder;
  if (((GLSLstd450)impl_local == GLSLstd450Exp2) || ((GLSLstd450)impl_local == GLSLstd450Log2)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::basic_string(&local_50,"dx.precise",(ThreadLocalAllocator<char> *)((long)&base_value + 7));
    bVar2 = LLVMBC::Instruction::hasMetadata((Instruction *)pBVar1,&local_50);
    local_6d = 1;
    if (!bVar2) {
      local_6d = *(byte *)((long)&instruction_local[0x19].super_Instruction.attachments._M_h.
                                  _M_buckets + 3);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::~basic_string(&local_50);
    local_29 = local_6d & 1;
    if (local_29 != 0) goto LAB_002051c4;
    if ((GLSLstd450)impl_local == GLSLstd450Exp2) {
      pVVar4 = LLVMBC::Instruction::getOperand((Instruction *)builder,1);
      bVar2 = value_is_dx_op_instrinsic(pVVar4,Log);
      if (bVar2) goto LAB_0020515c;
    }
    pVVar4 = LLVMBC::Instruction::getOperand((Instruction *)builder,1);
    bVar2 = value_is_dx_op_instrinsic(pVVar4,Exp);
    if (bVar2) {
LAB_0020515c:
      pVVar4 = LLVMBC::Instruction::getOperand((Instruction *)builder,1);
      pCVar5 = LLVMBC::cast<LLVMBC::CallInst>(pVVar4);
      pVVar4 = LLVMBC::Instruction::getOperand(&pCVar5->super_Instruction,1);
      pCVar5 = instruction_local;
      pBVar1 = builder;
      IVar3 = Converter::Impl::get_id_for_value((Impl *)instruction_local,pVVar4,0);
      Converter::Impl::rewrite_value((Impl *)pCVar5,(Value *)pBVar1,IVar3);
      return true;
    }
  }
LAB_002051c4:
  if ((int)instruction_local[0x16].super_Instruction.attachments._M_h._M_element_count == 0) {
    IVar3 = spv::Builder::import(pBStack_28,"GLSL.std.450");
    *(Id *)&instruction_local[0x16].super_Instruction.attachments._M_h._M_element_count = IVar3;
  }
  this = Converter::Impl::allocate((Impl *)instruction_local,OpExtInst,(Value *)builder);
  Operation::add_id(this,(Id)instruction_local[0x16].super_Instruction.attachments._M_h.
                             _M_element_count);
  Operation::add_literal(this,(GLSLstd450)impl_local);
  pCVar5 = instruction_local;
  pVVar4 = LLVMBC::Instruction::getOperand((Instruction *)builder,1);
  local_6c = Converter::Impl::get_id_for_value((Impl *)pCVar5,pVVar4,0);
  pCVar5 = instruction_local;
  if ((GLSLstd450)impl_local == GLSLstd450Sqrt) {
    pVVar4 = LLVMBC::Instruction::getOperand((Instruction *)builder,1);
    local_6c = build_clamped_non_negative_sqrt((Impl *)pCVar5,local_6c,pVVar4);
  }
  Operation::add_id(this,local_6c);
  Converter::Impl::add((Impl *)instruction_local,this,false);
  pCVar5 = instruction_local;
  type = LLVMBC::Value::getType((Value *)builder);
  Converter::Impl::decorate_relaxed_precision((Impl *)pCVar5,type,this->id,false);
  return true;
}

Assistant:

bool emit_dxil_std450_unary_instruction(GLSLstd450 opcode, Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	// Games rely on this peephole, since DXC doesn't do it for us.
	if (opcode == GLSLstd450Exp2 || opcode == GLSLstd450Log2)
	{
		bool precise = instruction->hasMetadata("dx.precise") || impl.options.force_precise;
		if (!precise)
		{
			if ((opcode == GLSLstd450Exp2 && value_is_dx_op_instrinsic(instruction->getOperand(1), DXIL::Op::Log)) ||
			    (value_is_dx_op_instrinsic(instruction->getOperand(1), DXIL::Op::Exp)))
			{
				auto *base_value = llvm::cast<llvm::CallInst>(instruction->getOperand(1))->getOperand(1);
				impl.rewrite_value(instruction, impl.get_id_for_value(base_value));
				return true;
			}
		}
	}

	if (!impl.glsl_std450_ext)
		impl.glsl_std450_ext = builder.import("GLSL.std.450");

	Operation *op = impl.allocate(spv::OpExtInst, instruction);
	op->add_id(impl.glsl_std450_ext);
	op->add_literal(opcode);

	spv::Id id = impl.get_id_for_value(instruction->getOperand(1));
	if (opcode == GLSLstd450Sqrt)
		id = build_clamped_non_negative_sqrt(impl, id, instruction->getOperand(1));

	op->add_id(id);

	impl.add(op);
	impl.decorate_relaxed_precision(instruction->getType(), op->id, false);
	return true;
}